

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void analyzeTable(Parse *pParse,Table *pTab,Index *pOnlyIdx)

{
  int iVar1;
  long in_RDX;
  Parse *in_RSI;
  undefined8 *in_RDI;
  int iStatCur;
  int iDb;
  Parse *in_stack_00000028;
  int in_stack_00000084;
  int in_stack_00000088;
  int in_stack_0000008c;
  Index *in_stack_00000090;
  Table *in_stack_00000098;
  Parse *in_stack_000000a0;
  int in_stack_ffffffffffffffdc;
  undefined4 uVar2;
  
  iVar1 = sqlite3SchemaToIndex((sqlite3 *)*in_RDI,(Schema *)in_RSI->pIdxEpr);
  sqlite3BeginWriteOperation(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX);
  uVar2 = *(undefined4 *)(in_RDI + 7);
  *(int *)(in_RDI + 7) = *(int *)(in_RDI + 7) + 3;
  if (in_RDX == 0) {
    openStatTable(in_stack_00000028,pParse._4_4_,(int)pParse,(char *)pTab,(char *)pOnlyIdx);
  }
  else {
    openStatTable(in_stack_00000028,pParse._4_4_,(int)pParse,(char *)pTab,(char *)pOnlyIdx);
  }
  analyzeOneTable(in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_0000008c,
                  in_stack_00000088,in_stack_00000084);
  loadAnalysis((Parse *)CONCAT44(iVar1,uVar2),in_stack_ffffffffffffffdc);
  return;
}

Assistant:

static void analyzeTable(Parse *pParse, Table *pTab, Index *pOnlyIdx){
  int iDb;
  int iStatCur;

  assert( pTab!=0 );
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  sqlite3BeginWriteOperation(pParse, 0, iDb);
  iStatCur = pParse->nTab;
  pParse->nTab += 3;
  if( pOnlyIdx ){
    openStatTable(pParse, iDb, iStatCur, pOnlyIdx->zName, "idx");
  }else{
    openStatTable(pParse, iDb, iStatCur, pTab->zName, "tbl");
  }
  analyzeOneTable(pParse, pTab, pOnlyIdx, iStatCur,pParse->nMem+1,pParse->nTab);
  loadAnalysis(pParse, iDb);
}